

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O2

void vkt::texture::anon_unknown_0::populateTextureShadowTests(TestCaseGroup *textureShadowTests)

{
  TestContext *testCtx;
  char *pcVar1;
  TestCaseGroup *pTVar2;
  TestNode *pTVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  allocator<char> local_13a;
  allocator<char> local_139;
  TestCaseGroup *local_138;
  TestContext *local_130;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> filterGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group2D;
  undefined1 local_e8 [8];
  undefined1 local_e0 [16];
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [24];
  pointer local_b0;
  undefined8 local_a8;
  int local_a0;
  TestNode *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string name;
  string local_50;
  
  testCtx = (textureShadowTests->super_TestNode).m_testCtx;
  local_98 = &textureShadowTests->super_TestNode;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  local_130 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,"2d","2D texture shadow lookup tests");
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar2;
  for (lVar5 = 0;
      pTVar2 = group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr, lVar5 != 6; lVar5 = lVar5 + 1) {
    local_138 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (local_138,local_130,populateTextureShadowTests::filters[lVar5].name,"");
    filterGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = local_138;
    for (lVar4 = 0;
        pTVar2 = filterGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar4 != 8; lVar4 = lVar4 + 1) {
      pcVar1 = populateTextureShadowTests::compareOp[lVar4].name;
      for (local_138 = (TestCaseGroup *)0x8; local_138 != (TestCaseGroup *)0x68;
          local_138 = (TestCaseGroup *)((long)local_138 + 0x10)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,pcVar1,(allocator<char> *)&local_50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,&local_90,"_");
        pTVar2 = local_138;
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e8,*(char **)((long)&PTR_typeinfo_00bdef18 + (long)local_138));
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)&local_90);
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)local_e8);
        local_e0._0_4_ = populateTextureShadowTests::filters[lVar5].minFilter;
        local_e0._4_4_ = populateTextureShadowTests::filters[lVar5].magFilter;
        local_d0 = *(undefined4 *)
                    ((long)&populateTextureShadowTests::formats[0].name + (long)pTVar2);
        local_a8._0_4_ = populateTextureShadowTests::compareOp[lVar4].op;
        local_e0._8_8_ = &DAT_200000002;
        local_b0 = (pointer)0x4000000020;
        local_90._M_dataplus._M_p._0_4_ = 3;
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        emplace_back<vkt::texture::util::Program>
                  ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                    *)local_c8,(Program *)&local_90);
        pTVar2 = filterGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        pTVar3 = (TestNode *)operator_new(0xb8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,name._M_dataplus._M_p,&local_139);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_13a);
        TestCase::TestCase((TestCase *)pTVar3,local_130,&local_90,&local_50);
        pTVar3->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00bdf070;
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)(pTVar3 + 1),
                   (Texture2DTestCaseParameters *)local_e8);
        *(int *)&pTVar3[1].m_description.field_2 = (int)local_a8;
        tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar3);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
        ::~_Vector_base((_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                         *)local_c8);
        std::__cxx11::string::~string((string *)&name);
      }
      local_138 = (TestCaseGroup *)0x68;
    }
    filterGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(group2D.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar2->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&filterGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  }
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(local_98,&pTVar2->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>)
  ;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,local_130,"cube","Cube map texture shadow lookup tests");
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar2;
  for (lVar5 = 0;
      pTVar2 = group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr, lVar5 != 6; lVar5 = lVar5 + 1) {
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar2,local_130,populateTextureShadowTests::filters[lVar5].name,"");
    filterGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = pTVar2;
    for (lVar4 = 0;
        pTVar2 = filterGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar4 != 8; lVar4 = lVar4 + 1) {
      pcVar1 = populateTextureShadowTests::compareOp[lVar4].name;
      for (local_138 = (TestCaseGroup *)0x8; local_138 != (TestCaseGroup *)0x68;
          local_138 = (TestCaseGroup *)((long)local_138 + 0x10)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,pcVar1,(allocator<char> *)&local_50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,&local_90,"_");
        pTVar2 = local_138;
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e8,*(char **)((long)&PTR_typeinfo_00bdef18 + (long)local_138));
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)&local_90);
        local_e8._0_4_ = VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_1_BIT;
        util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                  ((TextureCubeTestCaseParameters *)local_e0);
        local_e0._8_8_ = *(undefined8 *)&populateTextureShadowTests::filters[lVar5].minFilter;
        local_c8._0_4_ =
             *(VkFormat *)((long)&populateTextureShadowTests::formats[0].name + (long)pTVar2);
        local_e8._0_4_ = populateTextureShadowTests::compareOp[lVar4].op;
        _local_d0 = &DAT_200000002;
        local_a8._0_4_ = 0x20;
        local_90._M_dataplus._M_p._0_4_ = 0x13;
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        emplace_back<vkt::texture::util::Program>
                  ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                    *)(local_c8 + 8),(Program *)&local_90);
        pTVar2 = filterGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        pTVar3 = (TestNode *)operator_new(0xb8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,name._M_dataplus._M_p,&local_139);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_13a);
        TestCase::TestCase((TestCase *)pTVar3,local_130,&local_90,&local_50);
        pTVar3->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00bdf110;
        *(undefined4 *)&pTVar3[1]._vptr_TestNode = local_e8._0_4_;
        util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                  ((TextureCubeTestCaseParameters *)&pTVar3[1].m_testCtx,
                   (TextureCubeTestCaseParameters *)local_e0);
        tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar3);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
        ::~_Vector_base((_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                         *)(local_c8 + 8));
        std::__cxx11::string::~string((string *)&name);
      }
      local_138 = (TestCaseGroup *)0x68;
    }
    filterGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(group2D.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar2->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&filterGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  }
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(local_98,&pTVar2->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>)
  ;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,local_130,"2d_array","2D texture array shadow lookup tests");
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar2;
  for (lVar5 = 0;
      pTVar2 = group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr, lVar5 != 6; lVar5 = lVar5 + 1) {
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar2,local_130,populateTextureShadowTests::filters[lVar5].name,"");
    filterGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = pTVar2;
    for (lVar4 = 0;
        pTVar2 = filterGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar4 != 8; lVar4 = lVar4 + 1) {
      local_138 = (TestCaseGroup *)populateTextureShadowTests::compareOp[lVar4].name;
      for (lVar6 = 8; lVar6 != 0x68; lVar6 = lVar6 + 0x10) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,(char *)local_138,(allocator<char> *)&local_50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,&local_90,"_");
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e8,*(char **)((long)&PTR_typeinfo_00bdef18 + lVar6));
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)&local_90);
        local_e8._0_4_ = VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_1_BIT;
        util::Texture2DArrayTestCaseParameters::Texture2DArrayTestCaseParameters
                  ((Texture2DArrayTestCaseParameters *)local_e0);
        local_e0._8_8_ = *(undefined8 *)&populateTextureShadowTests::filters[lVar5].minFilter;
        local_c8._0_4_ = *(VkFormat *)((long)&populateTextureShadowTests::formats[0].name + lVar6);
        local_e8._0_4_ = populateTextureShadowTests::compareOp[lVar4].op;
        _local_d0 = &DAT_200000002;
        local_a8._0_4_ = 0x20;
        local_a8._4_4_ = 0x40;
        local_a0 = 8;
        local_90._M_dataplus._M_p._0_4_ = 0x1f;
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        emplace_back<vkt::texture::util::Program>
                  ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                    *)(local_c8 + 8),(Program *)&local_90);
        pTVar2 = filterGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        pTVar3 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,name._M_dataplus._M_p,&local_139);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_13a);
        TestCase::TestCase((TestCase *)pTVar3,local_130,&local_90,&local_50);
        pTVar3->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00bdf1b0;
        *(undefined4 *)&pTVar3[1]._vptr_TestNode = local_e8._0_4_;
        util::Texture2DArrayTestCaseParameters::Texture2DArrayTestCaseParameters
                  ((Texture2DArrayTestCaseParameters *)&pTVar3[1].m_testCtx,
                   (Texture2DArrayTestCaseParameters *)local_e0);
        tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar3);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
        ::~_Vector_base((_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                         *)(local_c8 + 8));
        std::__cxx11::string::~string((string *)&name);
      }
    }
    filterGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(group2D.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar2->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&filterGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  }
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(local_98,&pTVar2->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>)
  ;
  return;
}

Assistant:

void populateTextureShadowTests (tcu::TestCaseGroup* textureShadowTests)
{
	tcu::TestContext&				testCtx				= textureShadowTests->getTestContext();

	static const struct
	{
		const char*		name;
		const VkFormat	format;
	} formats[] =
	{
		{ "d16_unorm",				VK_FORMAT_D16_UNORM				},
		{ "x8_d24_unorm_pack32",	VK_FORMAT_X8_D24_UNORM_PACK32	},
		{ "d32_sfloat",				VK_FORMAT_D32_SFLOAT			},
		{ "d16_unorm_s8_uint",		VK_FORMAT_D16_UNORM_S8_UINT		},
		{ "d24_unorm_s8_uint",		VK_FORMAT_D24_UNORM_S8_UINT		},
		{ "d32_sfloat_s8_uint",		VK_FORMAT_D32_SFLOAT_S8_UINT	}
	};

	static const struct
	{
		const char*					name;
		const Sampler::FilterMode	minFilter;
		const Sampler::FilterMode	magFilter;
	} filters[] =
	{
		{ "nearest",				Sampler::NEAREST,					Sampler::NEAREST	},
		{ "linear",					Sampler::LINEAR,					Sampler::LINEAR		},
		{ "nearest_mipmap_nearest",	Sampler::NEAREST_MIPMAP_NEAREST,	Sampler::LINEAR		},
		{ "linear_mipmap_nearest",	Sampler::LINEAR_MIPMAP_NEAREST,		Sampler::LINEAR		},
		{ "nearest_mipmap_linear",	Sampler::NEAREST_MIPMAP_LINEAR,		Sampler::LINEAR		},
		{ "linear_mipmap_linear",	Sampler::LINEAR_MIPMAP_LINEAR,		Sampler::LINEAR		}
	};

	static const struct
	{
		const char*					name;
		const Sampler::CompareMode	op;
	} compareOp[] =
	{
		{ "less_or_equal",		Sampler::COMPAREMODE_LESS_OR_EQUAL		},
		{ "greater_or_equal",	Sampler::COMPAREMODE_GREATER_OR_EQUAL	},
		{ "less",				Sampler::COMPAREMODE_LESS				},
		{ "greater",			Sampler::COMPAREMODE_GREATER			},
		{ "equal",				Sampler::COMPAREMODE_EQUAL				},
		{ "not_equal",			Sampler::COMPAREMODE_NOT_EQUAL			},
		{ "always",				Sampler::COMPAREMODE_ALWAYS				},
		{ "never",				Sampler::COMPAREMODE_NEVER				}
	};

	// 2D cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group2D	(new tcu::TestCaseGroup(testCtx, "2d", "2D texture shadow lookup tests"));

		for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(filters); filterNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup>	filterGroup	(new tcu::TestCaseGroup(testCtx, filters[filterNdx].name, ""));

			for (int compareNdx = 0; compareNdx < DE_LENGTH_OF_ARRAY(compareOp); compareNdx++)
			{
				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const string						name			= string(compareOp[compareNdx].name) + "_" + formats[formatNdx].name;
					Texture2DShadowTestCaseParameters	testParameters;

					testParameters.minFilter	= filters[filterNdx].minFilter;
					testParameters.magFilter	= filters[filterNdx].magFilter;
					testParameters.format		= formats[formatNdx].format;
					testParameters.compareOp	= compareOp[compareNdx].op;
					testParameters.wrapS		= Sampler::REPEAT_GL;
					testParameters.wrapT		= Sampler::REPEAT_GL;
					testParameters.width		= 32;
					testParameters.height		= 64;

					testParameters.programs.push_back(PROGRAM_2D_SHADOW);

					filterGroup->addChild(new TextureTestCase<Texture2DShadowTestInstance>(testCtx, name.c_str(), "", testParameters));
				}
			}

			group2D->addChild(filterGroup.release());
		}

		textureShadowTests->addChild(group2D.release());
	}

	// Cubemap cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	groupCube	(new tcu::TestCaseGroup(testCtx, "cube", "Cube map texture shadow lookup tests"));

		for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(filters); filterNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup>	filterGroup	(new tcu::TestCaseGroup(testCtx, filters[filterNdx].name, ""));

			for (int compareNdx = 0; compareNdx < DE_LENGTH_OF_ARRAY(compareOp); compareNdx++)
			{
				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const string							name			= string(compareOp[compareNdx].name) + "_" + formats[formatNdx].name;
					TextureCubeShadowTestCaseParameters		testParameters;

					testParameters.minFilter	= filters[filterNdx].minFilter;
					testParameters.magFilter	= filters[filterNdx].magFilter;
					testParameters.format		= formats[formatNdx].format;
					testParameters.compareOp	= compareOp[compareNdx].op;
					testParameters.wrapS		= Sampler::REPEAT_GL;
					testParameters.wrapT		= Sampler::REPEAT_GL;
					testParameters.size			= 32;

					testParameters.programs.push_back(PROGRAM_CUBE_SHADOW);

					filterGroup->addChild(new TextureTestCase<TextureCubeShadowTestInstance>(testCtx, name.c_str(), "", testParameters));
				}
			}

			groupCube->addChild(filterGroup.release());
		}

		textureShadowTests->addChild(groupCube.release());
	}

	// 2D array cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group2DArray	(new tcu::TestCaseGroup(testCtx, "2d_array", "2D texture array shadow lookup tests"));

		for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(filters); filterNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup>	filterGroup	(new tcu::TestCaseGroup(testCtx, filters[filterNdx].name, ""));

			for (int compareNdx = 0; compareNdx < DE_LENGTH_OF_ARRAY(compareOp); compareNdx++)
			{
				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const string							name			= string(compareOp[compareNdx].name) + "_" + formats[formatNdx].name;
					Texture2DArrayShadowTestCaseParameters	testParameters;

					testParameters.minFilter	= filters[filterNdx].minFilter;
					testParameters.magFilter	= filters[filterNdx].magFilter;
					testParameters.format		= formats[formatNdx].format;
					testParameters.compareOp	= compareOp[compareNdx].op;
					testParameters.wrapS		= Sampler::REPEAT_GL;
					testParameters.wrapT		= Sampler::REPEAT_GL;
					testParameters.width		= 32;
					testParameters.height		= 64;
					testParameters.numLayers	= 8;

					testParameters.programs.push_back(PROGRAM_2D_ARRAY_SHADOW);

					filterGroup->addChild(new TextureTestCase<Texture2DArrayShadowTestInstance>(testCtx, name.c_str(), "", testParameters));
				}
			}

			group2DArray->addChild(filterGroup.release());
		}

		textureShadowTests->addChild(group2DArray.release());
	}
}